

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void arm_tr_translate_insn(DisasContextBase *dcbase,CPUState *cpu)

{
  CPUARMState_conflict *env_00;
  _Bool _Var1;
  int iVar2;
  DisasJumpType insn_00;
  uint insn;
  CPUARMState_conflict *env;
  DisasContextBase *__mptr;
  DisasContext_conflict1 *dc;
  CPUState *cpu_local;
  DisasContextBase *dcbase_local;
  
  env_00 = (CPUARMState_conflict *)cpu->env_ptr;
  _Var1 = arm_pre_translate_insn((DisasContext_conflict1 *)dcbase);
  if (!_Var1) {
    iVar2 = uc_addr_is_exit((uc_struct *)dcbase[8].pc_next,dcbase->pc_next);
    if (iVar2 == 0) {
      dcbase[1].pc_first = dcbase->pc_next;
      insn_00 = arm_ldl_code(env_00,dcbase->pc_next,*(int *)((long)&dcbase[2].pc_first + 4) != 0);
      dcbase[1].is_jmp = insn_00;
      if (*(int *)(dcbase[8].pc_next + 0x578) == 0) {
        dcbase->pc_next = dcbase->pc_next + 4;
        disas_arm_insn((DisasContext_conflict1 *)dcbase,insn_00);
        arm_post_translate_insn((DisasContext_conflict1 *)dcbase);
      }
      else {
        dcbase->is_jmp = DISAS_TARGET_2;
      }
    }
    else {
      dcbase->is_jmp = DISAS_TARGET_2;
    }
  }
  return;
}

Assistant:

static void arm_tr_translate_insn(DisasContextBase *dcbase, CPUState *cpu)
{
    DisasContext *dc = container_of(dcbase, DisasContext, base);
    CPUARMState *env = cpu->env_ptr;
    unsigned int insn;

    if (arm_pre_translate_insn(dc)) {
        return;
    }

    // Unicorn: end address tells us to stop emulation
    if (uc_addr_is_exit(dc->uc, dcbase->pc_next)) {
        // imitate WFI instruction to halt emulation
        dcbase->is_jmp = DISAS_WFI;
    } else {
        dc->pc_curr = dc->base.pc_next;
        insn = arm_ldl_code(env, dc->base.pc_next, dc->sctlr_b);
        dc->insn = insn;

        // Unicorn:
        //
        // If we get an error during fetching code, we have to skip the instruction decoding
        // to ensure the PC remains unchanged.
        //
        // This is to keep the same behavior with Unicorn1, though, it's inconsistent with
        // official arm documents.
        //
        // See discussion here: https://github.com/unicorn-engine/unicorn/issues/1536
        if (dc->uc->invalid_error) {
            dcbase->is_jmp = DISAS_WFI;
            return;
        }

        dc->base.pc_next += 4;
        disas_arm_insn(dc, insn);

        arm_post_translate_insn(dc);

        /* ARM is a fixed-length ISA.  We performed the cross-page check
           in init_disas_context by adjusting max_insns.  */
    }
}